

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

sz_sock sznet::net::sockets::sz_accept(sz_sock sockfd,sockaddr_in6 *addr)

{
  int sockfd_00;
  SourceFile file;
  Logger local_1000;
  undefined1 local_30 [12];
  socklen_t local_1c [2];
  socklen_t addrlen;
  
  local_1c[0] = 0x1c;
  sockfd_00 = accept(sockfd,(sockaddr *)addr,local_1c);
  if (sockfd_00 < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_30,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_30._0_8_;
    file.m_size = local_30._8_4_;
    Logger::Logger(&local_1000,file,0x114,FATAL);
    LogStream::operator<<(&local_1000.m_impl.m_stream,"sockets::sz_accept");
    Logger::~Logger(&local_1000);
  }
  else {
    sz_setnonblockandcloseonexec(sockfd_00);
  }
  return sockfd_00;
}

Assistant:

sz_sock sz_accept(sz_sock sockfd, struct sockaddr_in6* addr)
{
	socklen_t addrlen = static_cast<socklen_t>(sizeof *addr);
	sz_sock connfd = ::accept(sockfd, sz_sockaddr_cast(addr), &addrlen);
	if (connfd < 0)
	{
		LOG_FATAL << "sockets::sz_accept";
	}
	else
	{
		sz_setnonblockandcloseonexec(connfd);
	}

	return connfd;
}